

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# form.hpp
# Opt level: O1

number_validator<float> __thiscall
goodform::number_validator<float>::gte(number_validator<float> *this,float greater_or_equal_to)

{
  float fVar1;
  long *plVar2;
  size_type *psVar3;
  long *in_RSI;
  number_validator<float> nVar4;
  string local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  error_message local_40;
  
  if ((*(float *)(in_RSI + 1) <= greater_or_equal_to &&
       greater_or_equal_to != *(float *)(in_RSI + 1)) && (*(long *)(*in_RSI + 8) == 0)) {
    __gnu_cxx::__to_xstring<std::__cxx11::string,char>
              (&local_60,vsnprintf,0x3a,"%f",SUB84((double)greater_or_equal_to,0));
    plVar2 = (long *)std::__cxx11::string::replace((ulong)&local_60,0,(char *)0x0,0x132c5b);
    psVar3 = (size_type *)(plVar2 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar2 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar3) {
      local_80.field_2._M_allocated_capacity = *psVar3;
      local_80.field_2._8_8_ = plVar2[3];
      local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
    }
    else {
      local_80.field_2._M_allocated_capacity = *psVar3;
      local_80._M_dataplus._M_p = (pointer)*plVar2;
    }
    local_80._M_string_length = plVar2[1];
    *plVar2 = (long)psVar3;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    error_message::error_message(&local_40,&local_80);
    std::__cxx11::string::operator=((string *)*in_RSI,(string *)&local_40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40.message_._M_dataplus._M_p != &local_40.message_.field_2) {
      operator_delete(local_40.message_._M_dataplus._M_p,
                      local_40.message_.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != &local_80.field_2) {
      operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2) {
      operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
    }
  }
  this->error_ = (error_message *)*in_RSI;
  fVar1 = *(float *)(in_RSI + 1);
  this->value_ = fVar1;
  nVar4.value_ = fVar1;
  nVar4.error_ = (error_message *)this;
  nVar4._12_4_ = 0;
  return nVar4;
}

Assistant:

number_validator<N> number_validator<N>::gte(N greater_or_equal_to)
  {
    if (this->value_ < greater_or_equal_to && this->error_.empty())
      this->error_ = "VALUE MUST BE GREATER THAN OR EQUAL TO " + std::to_string(greater_or_equal_to);
    number_validator<N> ret(*this);
    return ret;
  }